

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

MethodPrototypeSymbol *
slang::ast::MethodPrototypeSymbol::fromSyntax
          (Scope *scope,ModportSubroutinePortSyntax *syntax,bool isExport)

{
  undefined1 *puVar1;
  FunctionPrototypeSyntax *pFVar2;
  bitmask<slang::ast::MethodFlags> bVar3;
  int iVar4;
  MethodPrototypeSymbol *pMVar5;
  SubroutineSymbol **ppSVar6;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  FunctionPortListSyntax *extraout_RDX;
  FunctionPortListSyntax *syntax_00;
  size_t extraout_RDX_00;
  Compilation *dst;
  undefined1 in_R9B;
  bool bVar7;
  Token TVar8;
  Token nameToken;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*> local_68 [2];
  
  dst = scope->compilation;
  pFVar2 = (syntax->prototype).ptr;
  TVar8 = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(pFVar2->name).ptr);
  nameToken.info = (Info *)(CONCAT71(in_register_00000011,isExport) & 0xffffffff);
  nameToken._0_8_ = TVar8.info;
  pMVar5 = createForModport((MethodPrototypeSymbol *)scope,(Scope *)syntax,TVar8._0_8_,nameToken,
                            (bool)in_R9B);
  ppSVar6 = std::optional<const_slang::ast::SubroutineSymbol_*>::value(&pMVar5->subroutine);
  if (*ppSVar6 != (SubroutineSymbol *)0x0) {
    bVar7 = (pFVar2->keyword).kind == TaskKeyword;
    pMVar5->subroutineKind = (uint)bVar7;
    if (bVar7) {
      (pMVar5->declaredReturnType).type = dst->voidType;
    }
    else {
      (pMVar5->declaredReturnType).typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar2->returnType).ptr;
      puVar1 = &(pMVar5->declaredReturnType).field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
    }
    local_68[0].data_ = (pointer)local_68[0].firstElement;
    local_68[0].len = 0;
    local_68[0].cap = 5;
    syntax_00 = pFVar2->portList;
    if (syntax_00 != (FunctionPortListSyntax *)0x0) {
      bVar3 = SubroutineSymbol::buildArguments
                        (&pMVar5->super_Scope,scope,syntax_00,Automatic,local_68);
      (pMVar5->flags).m_bits = (pMVar5->flags).m_bits | bVar3.m_bits;
      syntax_00 = extraout_RDX;
    }
    iVar4 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                      (local_68,(EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)syntax_00);
    (pMVar5->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
    (pMVar5->arguments)._M_extent._M_extent_value = extraout_RDX_00;
    pMVar5->needsMatchCheck = true;
    SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::cleanup(local_68,(EVP_PKEY_CTX *)dst)
    ;
  }
  return pMVar5;
}

Assistant:

MethodPrototypeSymbol& MethodPrototypeSymbol::fromSyntax(const Scope& scope,
                                                         const ModportSubroutinePortSyntax& syntax,
                                                         bool isExport) {
    auto& comp = scope.getCompilation();
    auto& proto = *syntax.prototype;
    auto& result = createForModport(scope, syntax, syntax.prototype->name->getLastToken(),
                                    isExport);

    auto target = result.subroutine.value();
    if (!target)
        return result;

    result.subroutineKind = proto.keyword.kind == TokenKind::TaskKeyword ? SubroutineKind::Task
                                                                         : SubroutineKind::Function;

    if (result.subroutineKind == SubroutineKind::Function)
        result.declaredReturnType.setTypeSyntax(*proto.returnType);
    else
        result.declaredReturnType.setType(comp.getVoidType());

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto.portList) {
        result.flags |= SubroutineSymbol::buildArguments(result, scope, *proto.portList,
                                                         VariableLifetime::Automatic, arguments);
    }

    result.arguments = arguments.copy(comp);
    result.needsMatchCheck = true;
    return result;
}